

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHighLevelEncoder.cpp
# Opt level: O2

int ZXing::Pdf417::EncodeText
              (wstring *msg,int startpos,int count,int submode,
              vector<int,_std::allocator<int>_> *output)

{
  wchar_t wVar1;
  pointer pwVar2;
  int iVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  int h;
  int local_6c;
  vector<int,_std::allocator<int>_> tmp;
  int local_34;
  
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(&tmp,(long)count);
  iVar4 = 0;
  local_6c = count;
LAB_001895a8:
  do {
    pwVar2 = (msg->_M_dataplus)._M_p;
    wVar1 = pwVar2[startpos + iVar4];
    if (submode == 0) {
      h = wVar1 + L'\xffffffbf';
      if (wVar1 == L' ' || (uint)h < 0x1a) {
        if (wVar1 == L' ') {
          h = 0x1a;
        }
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
      }
      else {
        if ((uint)(wVar1 + L'\xffffff9f') < 0x1a) {
          h = 0x1b;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
LAB_0018978a:
          submode = 1;
          goto LAB_001895a8;
        }
        if (((uint)wVar1 < 0x80) && (MIXED[(uint)wVar1] != -1)) {
          h = 0x1c;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
          submode = 2;
          goto LAB_001895a8;
        }
        h = 0x1d;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
        h = (int)(char)PUNCTUATION[wVar1];
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
        count = local_6c;
      }
    }
    else if (submode == 1) {
      h = wVar1 + L'\xffffff9f';
      if (wVar1 == L' ' || (uint)h < 0x1a) {
        if (wVar1 == L' ') {
          h = 0x1a;
        }
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
      }
      else if ((uint)(wVar1 + L'\xffffffbf') < 0x1a) {
        h = 0x1b;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
        h = wVar1 + L'\xffffffbf';
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
        count = local_6c;
      }
      else {
        if (((uint)wVar1 < 0x80) && (MIXED[(uint)wVar1] != -1)) {
          h = 0x1c;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
          submode = 2;
          count = local_6c;
          goto LAB_001895a8;
        }
        h = 0x1d;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
        h = (int)(char)PUNCTUATION[wVar1];
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
        count = local_6c;
      }
    }
    else if (submode == 2) {
      if (((uint)wVar1 < 0x80) && (h = (int)(char)MIXED[(uint)wVar1], h != -1)) {
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
      }
      else {
        if (wVar1 == L' ' || (uint)(wVar1 + L'\xffffffbf') < 0x1a) {
          h = 0x1c;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
          goto LAB_001896f4;
        }
        if ((uint)(wVar1 + L'\xffffff9f') < 0x1a) {
          h = 0x1b;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
          goto LAB_0018978a;
        }
        iVar3 = startpos + iVar4 + 1;
        if (((iVar3 < count) && (uVar5 = (ulong)(uint)pwVar2[iVar3], uVar5 < 0x80)) &&
           (PUNCTUATION[uVar5] != -1)) {
          h = 0x19;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
          submode = 3;
          goto LAB_001895a8;
        }
        h = 0x1d;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
        h = (int)(char)PUNCTUATION[wVar1];
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
        count = local_6c;
      }
    }
    else {
      if ((0x7f < (uint)wVar1) || (h = (int)(char)PUNCTUATION[wVar1], h == -1)) {
        h = 0x1d;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
LAB_001896f4:
        submode = 0;
        goto LAB_001895a8;
      }
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&h);
    }
    iVar4 = iVar4 + 1;
    if (count <= iVar4) {
      h = 0;
      uVar6 = (long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      for (uVar5 = 0; (long)uVar6 >> 2 != uVar5; uVar5 = uVar5 + 1) {
        if ((uVar5 & 1) == 0) {
          h = tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar5];
        }
        else {
          h = h * 0x1e +
              tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar5];
          std::vector<int,_std::allocator<int>_>::push_back(output,&h);
        }
      }
      if ((uVar6 & 4) != 0) {
        local_34 = h * 0x1e + 0x1d;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_34);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&tmp.super__Vector_base<int,_std::allocator<int>_>);
      return submode;
    }
  } while( true );
}

Assistant:

static int EncodeText(const std::wstring& msg, int startpos, int count, int submode, std::vector<int>& output)
{
	std::vector<int> tmp;
	tmp.reserve(count);
	int idx = 0;
	while (true) {
		int ch = msg[startpos + idx];
		switch (submode) {
		case SUBMODE_ALPHA:
			if (IsAlphaUpper(ch)) {
				tmp.push_back(ch == ' ' ? 26 : (ch - 65)); // space
			} else if (IsAlphaLower(ch)) {
				submode = SUBMODE_LOWER;
				tmp.push_back(27); // ll
				continue;
			} else if (IsMixed(ch)) {
				submode = SUBMODE_MIXED;
				tmp.push_back(28); // ml
				continue;
			} else {
				tmp.push_back(29); // ps
				tmp.push_back(PUNCTUATION[ch]);
			}
			break;
		case SUBMODE_LOWER:
			if (IsAlphaLower(ch)) {
				tmp.push_back(ch == ' ' ? 26 : (ch - 97)); // space
			} else if (IsAlphaUpper(ch)) {
				tmp.push_back(27); // as
				tmp.push_back(ch - 65);
				// space cannot happen here, it is also in "Lower"
			} else if (IsMixed(ch)) {
				submode = SUBMODE_MIXED;
				tmp.push_back(28); // ml
				continue;
			} else {
				tmp.push_back(29); // ps
				tmp.push_back(PUNCTUATION[ch]);
			}
			break;
		case SUBMODE_MIXED:
			if (IsMixed(ch)) {
				tmp.push_back(MIXED[ch]);
			} else if (IsAlphaUpper(ch)) {
				submode = SUBMODE_ALPHA;
				tmp.push_back(28); // al
				continue;
			} else if (IsAlphaLower(ch)) {
				submode = SUBMODE_LOWER;
				tmp.push_back(27); // ll
				continue;
			} else {
				if (startpos + idx + 1 < count) {
					int next = msg[startpos + idx + 1];
					if (IsPunctuation(next)) {
						submode = SUBMODE_PUNCTUATION;
						tmp.push_back(25); // pl
						continue;
					}
				}
				tmp.push_back(29); // ps
				tmp.push_back(PUNCTUATION[ch]);
			}
			break;
		default: // SUBMODE_PUNCTUATION
			if (IsPunctuation(ch)) {
				tmp.push_back(PUNCTUATION[ch]);
			} else {
				submode = SUBMODE_ALPHA;
				tmp.push_back(29); // al
				continue;
			}
		}
		idx++;
		if (idx >= count) {
			break;
		}
	}
	int h = 0;
	size_t len = tmp.size();
	for (size_t i = 0; i < len; i++) {
		bool odd = (i % 2) != 0;
		if (odd) {
			h = (h * 30) + tmp[i];
			output.push_back(h);
		}
		else {
			h = tmp[i];
		}
	}
	if ((len % 2) != 0) {
		output.push_back((h * 30) + 29); //ps
	}
	return submode;
}